

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::XMLWriter
          (XMLWriter *this,Ref<embree::SceneGraph::Node> *root,FileName *fileName,bool embedTextures
          ,bool referenceMaterials,bool binaryFormat)

{
  undefined8 uVar1;
  ostream *this_00;
  byte in_CL;
  int __oflag;
  long *in_RSI;
  XMLWriter *in_RDI;
  byte in_R8B;
  byte in_R9B;
  FileName binFileName;
  undefined5 in_stack_000001b8;
  FileName *in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe40;
  string *psVar2;
  _Ios_Iostate _Var3;
  FileName *in_stack_fffffffffffffe48;
  allocator local_139;
  string local_138 [32];
  long *local_118;
  allocator local_109;
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [64];
  string local_80 [53];
  byte local_4b;
  byte local_4a;
  byte local_49;
  long **local_30;
  long **local_18;
  
  local_49 = in_CL & 1;
  local_4a = in_R8B & 1;
  local_4b = in_R9B & 1;
  std::fstream::fstream(in_RDI);
  std::fstream::fstream(&in_RDI->bin);
  in_RDI->ident = 0;
  in_RDI->currentNodeID = 0;
  std::
  map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  ::map((map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
         *)0x3f6144);
  std::
  map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
  ::map((map<std::shared_ptr<embree::Texture>,_unsigned_long,_std::less<std::shared_ptr<embree::Texture>_>,_std::allocator<std::pair<const_std::shared_ptr<embree::Texture>,_unsigned_long>_>_>
         *)0x3f6160);
  in_RDI->embedTextures = (bool)(local_49 & 1);
  in_RDI->referenceMaterials = (bool)(local_4a & 1);
  in_RDI->binaryFormat = (bool)(local_4b & 1);
  uVar1 = *(undefined8 *)(*(long *)in_RDI + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)in_RDI + (int)uVar1);
  embree::FileName::operator_cast_to_string(in_stack_fffffffffffffdf8);
  std::fstream::open((string *)in_RDI,(_Ios_Openmode)local_80);
  std::__cxx11::string::~string(local_80);
  if ((local_4b & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,".bin",&local_c1);
    embree::FileName::addExt(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    _Var3 = (int)in_RDI + 0x210 + (int)*(undefined8 *)(*(long *)&in_RDI->bin + -0x18);
    std::operator|(_S_failbit,_S_badbit);
    std::ios::exceptions(_Var3);
    psVar2 = (string *)&in_RDI->bin;
    embree::FileName::operator_cast_to_string(in_stack_fffffffffffffdf8);
    std::operator|(_S_out,_S_bin);
    std::fstream::open(psVar2,(_Ios_Openmode)local_e8);
    std::__cxx11::string::~string(local_e8);
    embree::FileName::~FileName((FileName *)0x3f6356);
  }
  this_00 = std::operator<<((ostream *)&in_RDI->field_0x10,"<?xml version=\"1.0\"?>");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  (**(code **)(*(long *)*in_RSI + 0x30))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"scene",&local_109);
  open(in_RDI,(char *)local_108,__oflag);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  local_18 = &local_118;
  local_118 = (long *)*in_RSI;
  if (local_118 != (long *)0x0) {
    (**(code **)(*local_118 + 0x10))();
  }
  store((XMLWriter *)fileName,
        (Ref<embree::SceneGraph::Node> *)
        CONCAT17(embedTextures,CONCAT16(referenceMaterials,CONCAT15(binaryFormat,in_stack_000001b8))
                ));
  local_30 = &local_118;
  if (local_118 != (long *)0x0) {
    (**(code **)(*local_118 + 0x18))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"scene",&local_139);
  close(in_RDI,(int)local_138);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  (**(code **)(*(long *)*in_RSI + 0x40))();
  return;
}

Assistant:

XMLWriter::XMLWriter(Ref<SceneGraph::Node> root, const FileName& fileName, bool embedTextures, bool referenceMaterials, bool binaryFormat) 
    : ident(0), currentNodeID(0), embedTextures(embedTextures), referenceMaterials(referenceMaterials), binaryFormat(binaryFormat)
  {
    xml.exceptions (std::fstream::failbit | std::fstream::badbit);
    xml.open (fileName, std::fstream::out);

    if (binaryFormat)
    {
      const FileName binFileName = fileName.addExt(".bin");
      bin.exceptions (std::fstream::failbit | std::fstream::badbit);
      bin.open (binFileName, std::fstream::out | std::fstream::binary);
    }

    xml << "<?xml version=\"1.0\"?>" << std::endl;
    root->calculateInDegree();
    open("scene");
    store(root);
    close("scene");
    root->resetInDegree();
  }